

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::ComputeKindedSources(cmGeneratorTarget *this,KindedSources *files,string *config)

{
  size_t *this_00;
  cmSourceFile *pcVar1;
  bool bVar2;
  byte bVar3;
  TargetType TVar4;
  cmCustomCommand *pcVar5;
  ostream *poVar6;
  string *psVar7;
  reference ppcVar8;
  cmSourceFileLocation *this_01;
  cmake *this_02;
  pair<std::_Rb_tree_const_iterator<cmSourceFile_*>,_bool> pVar9;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  undefined1 local_528 [16];
  string local_518;
  undefined1 local_4f8 [8];
  cmSourceFile *i;
  iterator __end2;
  iterator __begin2;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range2;
  ostringstream e;
  cmListFileBacktrace local_360;
  value_type local_350;
  _Base_ptr local_330;
  undefined1 local_328;
  _Base_ptr local_320;
  undefined1 local_318 [8];
  undefined1 local_310 [8];
  string cppFileName;
  string hFileName_1;
  string xaml;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined1 local_280 [8];
  string hFileName;
  string resx;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  undefined1 local_1d0 [8];
  string ext;
  SourceKind kind;
  cmSourceFile *local_188;
  cmSourceFile *sf;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *s;
  iterator __end1;
  iterator __begin1;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> emitted;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> badObjLib;
  undefined1 local_108 [8];
  RegularExpression header_regex;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  srcs;
  string *config_local;
  KindedSources *files_local;
  cmGeneratorTarget *this_local;
  
  GetSourceFilePaths((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&header_regex.progsize,this,config);
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)local_108,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
             &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>::set
            ((set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> *)
             &__range1);
  __end1 = std::
           vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&header_regex.progsize);
  s = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::end((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&header_regex.progsize);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&s), bVar2) {
    sf = (cmSourceFile *)
         __gnu_cxx::
         __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::operator*(&__end1);
    local_188 = cmMakefile::GetOrCreateSource(this->Makefile,(string *)sf,false,Ambiguous);
    pVar9 = std::set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>::
            insert((set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
                    *)&__range1,&local_188);
    if (((pVar9.second ^ 0xffU) & 1) == 0) {
      psVar7 = cmSourceFile::GetExtension_abi_cxx11_(local_188);
      cmsys::SystemTools::LowerCase((string *)local_1d0,psVar7);
      pcVar5 = cmSourceFile::GetCustomCommand(local_188);
      if (pcVar5 == (cmCustomCommand *)0x0) {
        TVar4 = cmTarget::GetType(this->Target);
        pcVar1 = local_188;
        if (TVar4 == UTILITY) {
          ext.field_2._12_4_ = 4;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1f0,"HEADER_FILE_ONLY",&local_1f1);
          bVar2 = cmSourceFile::GetPropertyAsBool(pcVar1,&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::allocator<char>::~allocator(&local_1f1);
          pcVar1 = local_188;
          if (bVar2) {
            ext.field_2._12_4_ = 5;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_218,"EXTERNAL_OBJECT",&local_219);
            bVar2 = cmSourceFile::GetPropertyAsBool(pcVar1,&local_218);
            std::__cxx11::string::~string((string *)&local_218);
            std::allocator<char>::~allocator(&local_219);
            if (bVar2) {
              ext.field_2._12_4_ = 3;
            }
            else {
              cmSourceFile::GetLanguage_abi_cxx11_((string *)((long)&resx.field_2 + 8),local_188);
              bVar3 = std::__cxx11::string::empty();
              std::__cxx11::string::~string((string *)(resx.field_2._M_local_buf + 8));
              if (((bVar3 ^ 0xff) & 1) == 0) {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_1d0,"def");
                if (bVar2) {
                  ext.field_2._12_4_ = 8;
                  TVar4 = GetType(this);
                  if (TVar4 == OBJECT_LIBRARY) {
                    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                               &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_188)
                    ;
                  }
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_1d0,"idl");
                  if (bVar2) {
                    ext.field_2._12_4_ = 6;
                    TVar4 = GetType(this);
                    if (TVar4 == OBJECT_LIBRARY) {
                      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                                ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                                 &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 &local_188);
                    }
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_1d0,"resx");
                    if (bVar2) {
                      ext.field_2._12_4_ = 10;
                      psVar7 = cmSourceFile::GetFullPath(local_188,(string *)0x0);
                      std::__cxx11::string::string
                                ((string *)(hFileName.field_2._M_local_buf + 8),(string *)psVar7);
                      std::__cxx11::string::find_last_of
                                ((char)(&hFileName.field_2._M_allocated_capacity + 1),0x2e);
                      std::__cxx11::string::substr
                                ((ulong)&local_2a0,
                                 (ulong)(&hFileName.field_2._M_allocated_capacity + 1));
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_280,&local_2a0,".h");
                      std::__cxx11::string::~string((string *)&local_2a0);
                      std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::insert(&files->ExpectedResxHeaders,(value_type *)local_280);
                      std::__cxx11::string::~string((string *)local_280);
                      std::__cxx11::string::~string((string *)(hFileName.field_2._M_local_buf + 8));
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_1d0,"appxmanifest");
                      if (bVar2) {
                        ext.field_2._12_4_ = 0;
                      }
                      else {
                        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_1d0,"manifest");
                        if (bVar2) {
                          ext.field_2._12_4_ = 7;
                        }
                        else {
                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1d0,"pfx");
                          if (bVar2) {
                            ext.field_2._12_4_ = 1;
                          }
                          else {
                            bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1d0,"xaml");
                            if (bVar2) {
                              ext.field_2._12_4_ = 0xb;
                              psVar7 = cmSourceFile::GetFullPath(local_188,(string *)0x0);
                              std::__cxx11::string::string
                                        ((string *)(hFileName_1.field_2._M_local_buf + 8),
                                         (string *)psVar7);
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)((long)&cppFileName.field_2 + 8),
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)((long)&hFileName_1.field_2 + 8),".h");
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_310,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)((long)&hFileName_1.field_2 + 8),".cpp");
                              pVar10 = std::
                                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::insert(&files->ExpectedXamlHeaders,
                                                (value_type *)((long)&cppFileName.field_2 + 8));
                              local_320 = (_Base_ptr)pVar10.first._M_node;
                              local_318[0] = pVar10.second;
                              pVar10 = std::
                                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::insert(&files->ExpectedXamlSources,(value_type *)local_310)
                              ;
                              local_330 = (_Base_ptr)pVar10.first._M_node;
                              local_328 = pVar10.second;
                              std::__cxx11::string::~string((string *)local_310);
                              std::__cxx11::string::~string
                                        ((string *)(cppFileName.field_2._M_local_buf + 8));
                              std::__cxx11::string::~string
                                        ((string *)(hFileName_1.field_2._M_local_buf + 8));
                            }
                            else {
                              psVar7 = cmSourceFile::GetFullPath(local_188,(string *)0x0);
                              bVar2 = cmsys::RegularExpression::find
                                                ((RegularExpression *)local_108,psVar7);
                              if (bVar2) {
                                ext.field_2._12_4_ = 5;
                              }
                              else {
                                ext.field_2._12_4_ = 4;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
                ext.field_2._12_4_ = 9;
              }
            }
          }
        }
      }
      else {
        ext.field_2._12_4_ = 2;
      }
      pcVar1 = local_188;
      cmListFileBacktrace::cmListFileBacktrace
                (&local_360,(cmListFileBacktrace *)&(sf->Location).Directory.field_2);
      BT<cmSourceFile_*>::BT(&local_350.Source,pcVar1,&local_360);
      local_350.Kind = ext.field_2._12_4_;
      std::
      vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>::
      push_back(&files->Sources,&local_350);
      SourceAndKind::~SourceAndKind(&local_350);
      cmListFileBacktrace::~cmListFileBacktrace(&local_360);
      std::__cxx11::string::~string((string *)local_1d0);
    }
    __gnu_cxx::
    __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1);
  }
  bVar2 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::empty
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                     &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range2);
    poVar6 = std::operator<<((ostream *)&__range2,"OBJECT library \"");
    psVar7 = GetName_abi_cxx11_(this);
    poVar6 = std::operator<<(poVar6,(string *)psVar7);
    std::operator<<(poVar6,"\" contains:\n");
    this_00 = &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end2 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                       ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)this_00);
    i = (cmSourceFile *)
        std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                  ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                       *)&i), bVar2) {
      ppcVar8 = __gnu_cxx::
                __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                ::operator*(&__end2);
      local_4f8 = (undefined1  [8])*ppcVar8;
      poVar6 = std::operator<<((ostream *)&__range2,"  ");
      this_01 = cmSourceFile::GetLocation((cmSourceFile *)local_4f8);
      psVar7 = cmSourceFileLocation::GetName_abi_cxx11_(this_01);
      poVar6 = std::operator<<(poVar6,(string *)psVar7);
      std::operator<<(poVar6,"\n");
      __gnu_cxx::
      __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
      ::operator++(&__end2);
    }
    std::operator<<((ostream *)&__range2,
                    "but may contain only sources that compile, header files, and other files that would not affect linking of a normal library."
                   );
    this_02 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
    std::__cxx11::ostringstream::str();
    GetBacktrace((cmGeneratorTarget *)local_528);
    cmake::IssueMessage(this_02,FATAL_ERROR,(string *)(local_528 + 0x10),
                        (cmListFileBacktrace *)local_528);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_528);
    std::__cxx11::string::~string((string *)(local_528 + 0x10));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range2);
  }
  std::set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>::~set
            ((set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> *)
             &__range1);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
             &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_108);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&header_regex.progsize);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeKindedSources(KindedSources& files,
                                             std::string const& config) const
{
  // Get the source file paths by string.
  std::vector<BT<std::string>> srcs = this->GetSourceFilePaths(config);

  cmsys::RegularExpression header_regex(CM_HEADER_REGEX);
  std::vector<cmSourceFile*> badObjLib;

  std::set<cmSourceFile*> emitted;
  for (BT<std::string> const& s : srcs) {
    // Create each source at most once.
    cmSourceFile* sf = this->Makefile->GetOrCreateSource(s.Value);
    if (!emitted.insert(sf).second) {
      continue;
    }

    // Compute the kind (classification) of this source file.
    SourceKind kind;
    std::string ext = cmSystemTools::LowerCase(sf->GetExtension());
    if (sf->GetCustomCommand()) {
      kind = SourceKindCustomCommand;
    } else if (this->Target->GetType() == cmStateEnums::UTILITY) {
      kind = SourceKindExtra;
    } else if (sf->GetPropertyAsBool("HEADER_FILE_ONLY")) {
      kind = SourceKindHeader;
    } else if (sf->GetPropertyAsBool("EXTERNAL_OBJECT")) {
      kind = SourceKindExternalObject;
    } else if (!sf->GetLanguage().empty()) {
      kind = SourceKindObjectSource;
    } else if (ext == "def") {
      kind = SourceKindModuleDefinition;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (ext == "idl") {
      kind = SourceKindIDL;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (ext == "resx") {
      kind = SourceKindResx;
      // Build and save the name of the corresponding .h file
      // This relationship will be used later when building the project files.
      // Both names would have been auto generated from Visual Studio
      // where the user supplied the file name and Visual Studio
      // appended the suffix.
      std::string resx = sf->GetFullPath();
      std::string hFileName = resx.substr(0, resx.find_last_of('.')) + ".h";
      files.ExpectedResxHeaders.insert(hFileName);
    } else if (ext == "appxmanifest") {
      kind = SourceKindAppManifest;
    } else if (ext == "manifest") {
      kind = SourceKindManifest;
    } else if (ext == "pfx") {
      kind = SourceKindCertificate;
    } else if (ext == "xaml") {
      kind = SourceKindXaml;
      // Build and save the name of the corresponding .h and .cpp file
      // This relationship will be used later when building the project files.
      // Both names would have been auto generated from Visual Studio
      // where the user supplied the file name and Visual Studio
      // appended the suffix.
      std::string xaml = sf->GetFullPath();
      std::string hFileName = xaml + ".h";
      std::string cppFileName = xaml + ".cpp";
      files.ExpectedXamlHeaders.insert(hFileName);
      files.ExpectedXamlSources.insert(cppFileName);
    } else if (header_regex.find(sf->GetFullPath())) {
      kind = SourceKindHeader;
    } else {
      kind = SourceKindExtra;
    }

    // Save this classified source file in the result vector.
    files.Sources.push_back({ BT<cmSourceFile*>(sf, s.Backtrace), kind });
  }

  if (!badObjLib.empty()) {
    std::ostringstream e;
    e << "OBJECT library \"" << this->GetName() << "\" contains:\n";
    for (cmSourceFile* i : badObjLib) {
      e << "  " << i->GetLocation().GetName() << "\n";
    }
    e << "but may contain only sources that compile, header files, and "
         "other files that would not affect linking of a normal library.";
    this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR, e.str(), this->GetBacktrace());
  }
}